

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::addContentTokenFilter
          (QPDFObjectHandle *this,shared_ptr<QPDFObjectHandle::TokenFilter> *filter)

{
  shared_ptr<QPDFObjectHandle::TokenFilter> local_70 [2];
  allocator<char> local_49;
  string local_48 [32];
  QPDFObjectHandle local_28;
  shared_ptr<QPDFObjectHandle::TokenFilter> *local_18;
  shared_ptr<QPDFObjectHandle::TokenFilter> *filter_local;
  QPDFObjectHandle *this_local;
  
  local_18 = filter;
  filter_local = (shared_ptr<QPDFObjectHandle::TokenFilter> *)this;
  coalesceContentStreams(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/Contents",&local_49);
  getKey(&local_28,(string *)this);
  std::shared_ptr<QPDFObjectHandle::TokenFilter>::shared_ptr(local_70,filter);
  addTokenFilter(&local_28,local_70);
  std::shared_ptr<QPDFObjectHandle::TokenFilter>::~shared_ptr(local_70);
  ~QPDFObjectHandle(&local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void
QPDFObjectHandle::addContentTokenFilter(std::shared_ptr<TokenFilter> filter)
{
    coalesceContentStreams();
    this->getKey("/Contents").addTokenFilter(filter);
}